

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomctarg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  expr *peVar4;
  ull uVar5;
  ulong uVar6;
  char *pcVar7;
  expr **ppeVar8;
  ulong uVar9;
  
  if (ctx->reverse != 0) {
    pmVar3 = matchimm(ctx,(bitfield *)v,spos);
    return pmVar3;
  }
  peVar4 = makeex(EXPR_NUM);
  uVar5 = getbf((bitfield *)v,a,m,ctx);
  peVar4->num1 = uVar5;
  mark(ctx,(uint32_t)uVar5,2);
  iVar2 = is_nr_mark(ctx,(uint32_t)uVar5);
  if (iVar2 != 0) {
    ctx->endmark = 1;
  }
  peVar4->special = 2;
  iVar2 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  if (iVar2 < iVar1) {
    ppeVar8 = ctx->atoms;
  }
  else {
    iVar2 = iVar1 * 2;
    if (iVar1 == 0) {
      iVar2 = 0x10;
    }
    ctx->atomsmax = iVar2;
    ppeVar8 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
    ctx->atoms = ppeVar8;
    iVar2 = ctx->atomsnum;
  }
  ctx->atomsnum = iVar2 + 1;
  ppeVar8[iVar2] = peVar4;
  uVar9 = 0;
  uVar6 = (ulong)(uint)ctx->labelsnum;
  if (ctx->labelsnum < 1) {
    uVar6 = uVar9;
  }
  while( true ) {
    if (uVar6 * 0x18 - uVar9 == 0) {
      return (matches *)0x0;
    }
    if ((*(ull *)((long)&ctx->labels->val + uVar9) == uVar5) &&
       (*(long *)((long)&ctx->labels->name + uVar9) != 0)) break;
    uVar9 = uVar9 + 0x18;
  }
  peVar4 = makeex(EXPR_LABEL);
  pcVar7 = strdup(*(char **)((long)&ctx->labels->name + uVar9));
  peVar4->str = pcVar7;
  peVar4->special = 2;
  iVar2 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  ppeVar8 = ctx->atoms;
  if (iVar1 <= iVar2) {
    iVar2 = iVar1 * 2;
    if (iVar1 == 0) {
      iVar2 = 0x10;
    }
    ctx->atomsmax = iVar2;
    ppeVar8 = (expr **)realloc(ppeVar8,(long)iVar2 << 3);
    ctx->atoms = ppeVar8;
    iVar2 = ctx->atomsnum;
  }
  ctx->atomsnum = iVar2 + 1;
  ppeVar8[iVar2] = peVar4;
  return (matches *)0x0;
}

Assistant:

struct matches *atomctarg APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	mark(ctx, expr->num1, 2);
	if (is_nr_mark(ctx, expr->num1))
		ctx->endmark = 1;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	int i;
	for (i = 0; i < ctx->labelsnum; i++) {
		if (ctx->labels[i].val == expr->num1 && ctx->labels[i].name) {
			struct expr *expr = makeex(EXPR_LABEL);
			expr->str = strdup(ctx->labels[i].name);
			expr->special = 2;
			ADDARRAY(ctx->atoms, expr);
			return NULL;
		}
	}
	return NULL;
}